

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O3

void __thiscall
xLearn::MODEL_TEST_SerializeToTXT_Test::~MODEL_TEST_SerializeToTXT_Test
          (MODEL_TEST_SerializeToTXT_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MODEL_TEST, SerializeToTXT) {
  HyperParam hyper_param = Init();
  // linear
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_lr.SerializeToTXT("test_txt.linear");
  // fm
  hyper_param.score_func = "fm";
  Model model_fm;
  model_fm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_fm.SerializeToTXT("test_txt.fm");
  // ffm
  hyper_param.score_func = "ffm";
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_ffm.SerializeToTXT("test_txt.ffm");
}